

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O2

int nghttp2_stream_resume_deferred_item(nghttp2_stream *stream,uint8_t flags)

{
  int iVar1;
  byte bVar2;
  
  if (stream->item == (nghttp2_outbound_item *)0x0) {
    __assert_fail("stream->item",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0x217,"int nghttp2_stream_resume_deferred_item(nghttp2_stream *, uint8_t)");
  }
  bVar2 = ~flags & stream->flags;
  stream->flags = bVar2;
  if ((bVar2 & 0x1c) != 0) {
    return 0;
  }
  iVar1 = stream_obq_push(stream->dep_prev,stream);
  return iVar1;
}

Assistant:

int nghttp2_stream_resume_deferred_item(nghttp2_stream *stream, uint8_t flags) {
  assert(stream->item);

  DEBUGF("stream: stream=%d resume item=%p flags=%02x\n", stream->stream_id,
         stream->item, flags);

  stream->flags = (uint8_t)(stream->flags & ~flags);

  if (stream->flags & NGHTTP2_STREAM_FLAG_DEFERRED_ALL) {
    return 0;
  }

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return 0;
  }

  return stream_update_dep_on_attach_item(stream);
}